

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

bool __thiscall
bandit::detail::options::apply
          (options *this,controller_t *controller,option_map *choice,option_index index)

{
  char *pcVar1;
  bool bVar2;
  const_reference pvVar3;
  Option *pOVar4;
  pointer ppVar5;
  _Self local_80 [3];
  allocator local_61;
  key_type local_60;
  _Base_ptr local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>
  local_38;
  const_iterator it;
  option_index index_local;
  option_map *choice_local;
  controller_t *controller_local;
  options *this_local;
  
  it._M_node._4_4_ = index;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>
  ::_Rb_tree_const_iterator(&local_38,&choice->default_it);
  pvVar3 = std::vector<option::Option,_std::allocator<option::Option>_>::operator[]
                     (&this->options_,(ulong)it._M_node._4_4_);
  pOVar4 = option::Option::operator_cast_to_Option_(pvVar3);
  if (pOVar4 != (Option *)0x0) {
    pvVar3 = std::vector<option::Option,_std::allocator<option::Option>_>::operator[]
                       (&this->options_,(ulong)it._M_node._4_4_);
    pcVar1 = pvVar3->arg;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
    local_40 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
               ::find(&choice->map,&local_60);
    local_38._M_node = local_40;
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    local_80[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
         ::end(&choice->map);
    bVar2 = std::operator==(&local_38,local_80);
    if (bVar2) {
      return false;
    }
  }
  ppVar5 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>
           ::operator->(&local_38);
  std::function<void_(bandit::detail::controller_t_&)>::operator()(&ppVar5->second,controller);
  return true;
}

Assistant:

bool apply(controller_t& controller, const option_map& choice, enum option_index index) const {
        option_map::map_type::const_iterator it{choice.default_it};
        if (options_[index] != nullptr) {
          it = choice.map.find(std::string(options_[index].arg));
          if (it == choice.map.end()) {
            return false;
          }
        }
        it->second(controller);
        return true;
      }